

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

string * cmdline::detail::readable_typename<unsigned_int>(void)

{
  char *__ptr;
  string *ret;
  string *in_RDI;
  int status;
  allocator local_36;
  allocator local_35;
  undefined4 local_34;
  undefined8 local_30 [4];
  
  std::__cxx11::string::string
            ((string *)local_30,___cxa_end_catch + (*___cxa_end_catch == '*'),&local_36);
  local_34 = 0;
  __ptr = (char *)__cxa_demangle(local_30[0],0,0);
  std::__cxx11::string::string((string *)in_RDI,__ptr,&local_35);
  free(__ptr);
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

std::string readable_typename()
{
  return demangle(typeid(T).name());
}